

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum.cc
# Opt level: O2

void TestAddUInt64(void)

{
  bool bVar1;
  undefined1 in_CL;
  undefined1 uVar2;
  char *pcVar3;
  char *in_R8;
  char *in_R9;
  Bignum bignum;
  char buffer [1024];
  
  bignum.used_bigits_ = 0;
  bignum.exponent_ = 0;
  AssignHexString(&bignum,"0");
  double_conversion::Bignum::AddUInt64(&bignum,10);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0xa3,0xc0802c,(char *)(ulong)bVar1,(bool)in_CL);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0xa4,0xc0805f,"A",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  AssignHexString(&bignum,"1");
  double_conversion::Bignum::AddUInt64(&bignum,10);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0xa8,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0xa9,0xc0821f,"B",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  AssignHexString(&bignum,"1");
  double_conversion::Bignum::AddUInt64(&bignum,0x100);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0xad,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0xae,0xc08225,"101",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  AssignHexString(&bignum,"1");
  double_conversion::Bignum::AddUInt64(&bignum,0xffff);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0xb2,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0xb3,0xc0822b,"10000",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  AssignHexString(&bignum,"FFFFFFF");
  double_conversion::Bignum::AddUInt64(&bignum,1);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0xb7,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0xb8,0xc08233,"10000000",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  AssignHexString(&bignum,"10000000000000000000000000000000000000000000");
  double_conversion::Bignum::AddUInt64(&bignum,0xffff);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0xbc,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0xbd,0xc08274,"1000000000000000000000000000000000000000FFFF",buffer,
                    in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  AssignHexString(&bignum,"FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF");
  double_conversion::Bignum::AddUInt64(&bignum,1);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0xc1,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0xc2,0xc082fd,"100000000000000000000000000000000000000000000",buffer,
                    in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  double_conversion::Bignum::AssignUInt16(&bignum,1);
  double_conversion::Bignum::ShiftLeft(&bignum,100);
  double_conversion::Bignum::AddUInt64(&bignum,1);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0xc7,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0xc8,0xc0835b,"10000000000000000000000001",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  double_conversion::Bignum::AssignUInt16(&bignum,1);
  double_conversion::Bignum::ShiftLeft(&bignum,100);
  double_conversion::Bignum::AddUInt64(&bignum,0xffff);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0xcd,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0xce,0xc08393,"1000000000000000000000FFFF",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  AssignHexString(&bignum,"0");
  double_conversion::Bignum::AddUInt64(&bignum,0xa00000000);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0xd2,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0xd3,0xc083cb,"A00000000",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  AssignHexString(&bignum,"1");
  double_conversion::Bignum::AddUInt64(&bignum,0xa00000000);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0xd7,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0xd8,0xc083e1,"A00000001",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  AssignHexString(&bignum,"1");
  double_conversion::Bignum::AddUInt64(&bignum,0x10000000000);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0xdc,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0xdd,0xc083f7,"10000000001",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  AssignHexString(&bignum,"1");
  double_conversion::Bignum::AddUInt64(&bignum,0xffff00000000);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0xe1,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0xe2,0xc08411,"FFFF00000001",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  AssignHexString(&bignum,"FFFFFFF");
  double_conversion::Bignum::AddUInt64(&bignum,0x100000000);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0xe6,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0xe7,0xc0842d,"10FFFFFFF",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  AssignHexString(&bignum,"10000000000000000000000000000000000000000000");
  double_conversion::Bignum::AddUInt64(&bignum,0xffff00000000);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0xeb,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0xec,0xc08443,"10000000000000000000000000000000FFFF00000000",buffer,
                    in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  AssignHexString(&bignum,"FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF");
  double_conversion::Bignum::AddUInt64(&bignum,0x100000000);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0xf0,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0xf1,0xc0849f,"1000000000000000000000000000000000000FFFFFFFF",buffer,
                    in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  double_conversion::Bignum::AssignUInt16(&bignum,1);
  double_conversion::Bignum::ShiftLeft(&bignum,100);
  double_conversion::Bignum::AddUInt64(&bignum,0x100000000);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0xf6,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0xf7,0xc084fd,"10000000000000000100000000",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  double_conversion::Bignum::AssignUInt16(&bignum,1);
  double_conversion::Bignum::ShiftLeft(&bignum,100);
  double_conversion::Bignum::AddUInt64(&bignum,0xffff00000000);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0xfc,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  CheckEqualsHelper((char *)0xfd,0xc08535,"10000000000000FFFF00000000",buffer,in_R8,in_R9);
  return;
}

Assistant:

TEST(AddUInt64) {
  char buffer[kBufferSize];
  Bignum bignum;
  AssignHexString(&bignum, "0");
  bignum.AddUInt64(0xA);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("A", buffer);

  AssignHexString(&bignum, "1");
  bignum.AddUInt64(0xA);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("B", buffer);

  AssignHexString(&bignum, "1");
  bignum.AddUInt64(0x100);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("101", buffer);

  AssignHexString(&bignum, "1");
  bignum.AddUInt64(0xFFFF);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000", buffer);

  AssignHexString(&bignum, "FFFFFFF");
  bignum.AddUInt64(0x1);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000", buffer);

  AssignHexString(&bignum, "10000000000000000000000000000000000000000000");
  bignum.AddUInt64(0xFFFF);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1000000000000000000000000000000000000000FFFF", buffer);

  AssignHexString(&bignum, "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF");
  bignum.AddUInt64(0x1);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("100000000000000000000000000000000000000000000", buffer);

  bignum.AssignUInt16(0x1);
  bignum.ShiftLeft(100);
  bignum.AddUInt64(1);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000000000000001", buffer);

  bignum.AssignUInt16(0x1);
  bignum.ShiftLeft(100);
  bignum.AddUInt64(0xFFFF);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1000000000000000000000FFFF", buffer);

  AssignHexString(&bignum, "0");
  bignum.AddUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0xA, 00000000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("A00000000", buffer);

  AssignHexString(&bignum, "1");
  bignum.AddUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0xA, 00000000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("A00000001", buffer);

  AssignHexString(&bignum, "1");
  bignum.AddUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0x100, 00000000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000001", buffer);

  AssignHexString(&bignum, "1");
  bignum.AddUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0xFFFF, 00000000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FFFF00000001", buffer);

  AssignHexString(&bignum, "FFFFFFF");
  bignum.AddUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0x1, 00000000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10FFFFFFF", buffer);

  AssignHexString(&bignum, "10000000000000000000000000000000000000000000");
  bignum.AddUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0xFFFF, 00000000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000000000000000000000FFFF00000000", buffer);

  AssignHexString(&bignum, "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF");
  bignum.AddUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0x1, 00000000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1000000000000000000000000000000000000FFFFFFFF", buffer);

  bignum.AssignUInt16(0x1);
  bignum.ShiftLeft(100);
  bignum.AddUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0x1, 00000000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000000100000000", buffer);

  bignum.AssignUInt16(0x1);
  bignum.ShiftLeft(100);
  bignum.AddUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0xFFFF, 00000000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000FFFF00000000", buffer);
}